

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

string * deqp::gles3::Performance::repeat
                   (string *__return_storage_ptr__,string *str,int numRepeats,string *delim)

{
  pointer pcVar1;
  string *extraout_RAX;
  string *psVar2;
  string *extraout_RAX_00;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  psVar2 = extraout_RAX;
  if (1 < numRepeats) {
    iVar3 = numRepeats + -1;
    do {
      std::operator+(&local_50,delim,str);
      psVar2 = (string *)
               std::__cxx11::string::_M_append
                         ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        psVar2 = extraout_RAX_00;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return psVar2;
}

Assistant:

static inline string repeat (const string& str, int numRepeats, const string& delim = "")
{
	string result = str;
	for (int i = 1; i < numRepeats; i++)
		result += delim + str;
	return result;
}